

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcCheck.c
# Opt level: O0

int Abc_NtkIsAcyclicHierarchy(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  int local_1c;
  int RetValue;
  int i;
  Abc_Ntk_t *pTemp;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkIsNetlist(pNtk);
  if ((iVar1 != 0) && (pNtk->pDesign != (Abc_Des_t *)0x0)) {
    for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->pDesign->vModules), local_1c < iVar1;
        local_1c = local_1c + 1) {
      pvVar3 = Vec_PtrEntry(pNtk->pDesign->vModules,local_1c);
      *(undefined4 *)((long)pvVar3 + 0xc4) = 0;
      *(undefined4 *)((long)pvVar3 + 0xc0) = 0;
    }
    pNtk->fHiePath = 1;
    iVar1 = Abc_NtkIsAcyclicHierarchy_rec(pNtk);
    pNtk->fHiePath = 0;
    for (local_1c = 0; iVar2 = Vec_PtrSize(pNtk->pDesign->vModules), local_1c < iVar2;
        local_1c = local_1c + 1) {
      pvVar3 = Vec_PtrEntry(pNtk->pDesign->vModules,local_1c);
      *(undefined4 *)((long)pvVar3 + 0xc4) = 0;
      *(undefined4 *)((long)pvVar3 + 0xc0) = 0;
    }
    return iVar1;
  }
  __assert_fail("Abc_NtkIsNetlist(pNtk) && pNtk->pDesign",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcCheck.c"
                ,0x332,"int Abc_NtkIsAcyclicHierarchy(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkIsAcyclicHierarchy( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pTemp;
    int i, RetValue;
    assert( Abc_NtkIsNetlist(pNtk) && pNtk->pDesign );
    // clear the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = pTemp->fHiePath = 0;
    // traverse
    pNtk->fHiePath = 1;
    RetValue = Abc_NtkIsAcyclicHierarchy_rec( pNtk );
    pNtk->fHiePath = 0;
    // clear the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pTemp, i )
        pTemp->fHieVisited = pTemp->fHiePath = 0;
    return RetValue;
}